

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O0

void Int_ManProofWriteOne(Int_Man_t *p,Sto_Cls_t *pClause)

{
  FILE *pFVar1;
  uint uVar2;
  int n;
  int local_1c;
  int v;
  Sto_Cls_t *pClause_local;
  Int_Man_t *p_local;
  
  n = p->Counter + 1;
  p->Counter = n;
  Int_ManProofSet(p,pClause,n);
  if (p->fProofWrite != 0) {
    pFVar1 = (FILE *)p->pFile;
    uVar2 = Int_ManProofGet(p,pClause);
    fprintf(pFVar1,"%d",(ulong)uVar2);
    for (local_1c = 0; local_1c < (int)(*(uint *)&pClause->field_0x1c >> 3 & 0xffffff);
        local_1c = local_1c + 1) {
      pFVar1 = (FILE *)p->pFile;
      uVar2 = lit_print(*(lit *)((long)&pClause[1].pNext + (long)local_1c * 4));
      fprintf(pFVar1," %d",(ulong)uVar2);
    }
    fprintf((FILE *)p->pFile," 0 0\n");
  }
  return;
}

Assistant:

void Int_ManProofWriteOne( Int_Man_t * p, Sto_Cls_t * pClause )
{
    Int_ManProofSet( p, pClause, ++p->Counter );

    if ( p->fProofWrite )
    {
        int v;
        fprintf( p->pFile, "%d", Int_ManProofGet(p, pClause) );
        for ( v = 0; v < (int)pClause->nLits; v++ )
            fprintf( p->pFile, " %d", lit_print(pClause->pLits[v]) );
        fprintf( p->pFile, " 0 0\n" );
    }
}